

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O0

int log_aspect_detach(log_aspect aspect,log_policy policy)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int result;
  size_t iterator;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    if (*(ulong *)(in_RDI + 0x18) <= local_20) {
      return 1;
    }
    if (in_RSI == *(long *)(*(long *)(in_RDI + 0x10) + local_20 * 8)) break;
    local_20 = local_20 + 1;
  }
  iVar1 = log_policy_destroy((log_policy)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  memmove((void *)(*(long *)(in_RDI + 0x10) + local_20 * 8),
          (void *)(*(long *)(in_RDI + 0x10) + (local_20 + 1) * 8),
          (*(long *)(in_RDI + 0x18) - local_20) - 1);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -1;
  return iVar1;
}

Assistant:

int log_aspect_detach(log_aspect aspect, log_policy policy)
{
	size_t iterator;

	for (iterator = 0; iterator < aspect->count; ++iterator)
	{
		if (policy == aspect->policies[iterator])
		{
			int result = log_policy_destroy(aspect->policies[iterator]);

			memmove(&aspect->policies[iterator], &aspect->policies[iterator + 1], aspect->count - iterator - 1);

			--aspect->count;

			return result;
		}
	}

	return 1;
}